

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O2

void __thiscall
c4::yml::
Emitter<c4::yml::WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
::_write_scalar(Emitter<c4::yml::WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *this,csubstr s,bool was_quoted)

{
  code *pcVar1;
  Location loc;
  csubstr sp;
  csubstr sp_00;
  char c;
  bool bVar2;
  error_flags eVar3;
  size_t sVar4;
  size_t sVar5;
  ro_substr chars;
  ro_substr pattern;
  ro_substr chars_00;
  ro_substr chars_01;
  csubstr cVar6;
  csubstr s_local;
  char *pcStack_30;
  
  s_local.len = s.len;
  s_local.str = s.str;
  if (s_local.len == 0) {
    if (was_quoted || s_local.str != (char *)0x0) {
      WriterOStream<std::__cxx11::stringstream>::_do_write<3ul>
                ((WriterOStream<std::__cxx11::stringstream> *)this,(char (*) [3])"\'\'");
      return;
    }
  }
  else if ((was_quoted) ||
          ((bVar2 = basic_substring<const_char>::is_number(&s_local), !bVar2 &&
           ((((chars.len = 9, chars.str = " \n\t\r*&%@`",
              bVar2 = basic_substring<const_char>::begins_with_any(&s_local,chars), bVar2 ||
              (pattern.len = 2, pattern.str = "<<",
              bVar2 = basic_substring<const_char>::begins_with(&s_local,pattern), bVar2)) ||
             (chars_00.len = 4, chars_00.str = " \n\t\r",
             bVar2 = basic_substring<const_char>::ends_with_any(&s_local,chars_00), bVar2)) ||
            (chars_01.len = 0xc, chars_01.str = "#:-?,\n{}[]\'\"",
            sVar4 = basic_substring<const_char>::first_of(&s_local,chars_01,0),
            sVar4 != 0xffffffffffffffff)))))) {
    sVar4 = basic_substring<const_char>::first_of(&s_local,'\"',0);
    sVar5 = basic_substring<const_char>::first_of(&s_local,'\'',0);
    if (sVar5 == 0xffffffffffffffff && sVar4 != 0xffffffffffffffff) {
      c = '\'';
    }
    else {
      if (sVar4 != 0xffffffffffffffff || sVar5 == 0xffffffffffffffff) {
        cVar6.len = s_local.len;
        cVar6.str = s_local.str;
        _write_scalar_squo(this,cVar6,0);
        return;
      }
      sVar4 = basic_substring<const_char>::count(&s_local,'\n',0);
      if (sVar4 != 0) {
        eVar3 = get_error_flags();
        if (((eVar3 & 1) != 0) && (bVar2 = is_debugger_attached(), bVar2)) {
          pcVar1 = (code *)swi(3);
          (*pcVar1)();
          return;
        }
        cVar6 = to_csubstr(
                          "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                          );
        pcStack_30 = cVar6.str;
        loc.super_LineCol.col = 0;
        loc.super_LineCol.offset = SUB168(ZEXT816(0x5b6f) << 0x40,0);
        loc.super_LineCol.line = SUB168(ZEXT816(0x5b6f) << 0x40,8);
        loc.name.str = pcStack_30;
        loc.name.len = cVar6.len;
        yml::error("check failed: s.count(\'\\n\') == 0",0x20,loc);
      }
      c = '\"';
    }
    WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::_do_write(&this->
                 super_WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ,c);
    sp_00.len = s_local.len;
    sp_00.str = s_local.str;
    WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::_do_write(&this->
                 super_WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ,sp_00);
    WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::_do_write(&this->
                 super_WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ,c);
  }
  else {
    sp.len = s_local.len;
    sp.str = s_local.str;
    WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::_do_write(&this->
                 super_WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ,sp);
  }
  return;
}

Assistant:

void Emitter<Writer>::_write_scalar(csubstr s, bool was_quoted)
{
    // this block of code needed to be moved to before the needs_quotes
    // assignment to work around a g++ optimizer bug where (s.str != nullptr)
    // was evaluated as true even if s.str was actually a nullptr (!!!)
    if(s.len == size_t(0))
    {
        if(was_quoted || s.str != nullptr)
            this->Writer::_do_write("''");
        return;
    }

    const bool needs_quotes = (
        was_quoted
        ||
        (
            ( ! s.is_number())
            &&
            (
                // has leading whitespace
                // looks like reference or anchor
                // would be treated as a directive
                // see https://www.yaml.info/learn/quote.html#noplain
                s.begins_with_any(" \n\t\r*&%@`")
                ||
                s.begins_with("<<")
                ||
                // has trailing whitespace
                s.ends_with_any(" \n\t\r")
                ||
                // has special chars
                (s.first_of("#:-?,\n{}[]'\"") != npos)
            )
        )
    );

    if( ! needs_quotes)
    {
        this->Writer::_do_write(s);
    }
    else
    {
        const bool has_dquotes = s.first_of( '"') != npos;
        const bool has_squotes = s.first_of('\'') != npos;
        if(!has_squotes && has_dquotes)
        {
            this->Writer::_do_write('\'');
            this->Writer::_do_write(s);
            this->Writer::_do_write('\'');
        }
        else if(has_squotes && !has_dquotes)
        {
            RYML_ASSERT(s.count('\n') == 0);
            this->Writer::_do_write('"');
            this->Writer::_do_write(s);
            this->Writer::_do_write('"');
        }
        else
        {
            _write_scalar_squo(s, /*FIXME FIXME FIXME*/0);
        }
    }
}